

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNRPL.cpp
# Opt level: O3

void __thiscall NaNNRegrPlantLearn::~NaNNRegrPlantLearn(NaNNRegrPlantLearn *this)

{
  ~NaNNRegrPlantLearn(this);
  operator_delete(this,0x19c8);
  return;
}

Assistant:

NaNNRegrPlantLearn::~NaNNRegrPlantLearn ()
{
    // Nothing to do
}